

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_bool32 drwav_seek_to_first_pcm_frame(drwav *pWav)

{
  drwav_uint16 dVar1;
  drwav_bool32 dVar2;
  drwav_bool32 dVar3;
  
  dVar3 = 0;
  if (pWav->onWrite == (drwav_write_proc)0x0) {
    dVar3 = 0;
    dVar2 = (*pWav->onSeek)(pWav->pUserData,(int)pWav->dataChunkDataPos,drwav_seek_origin_start);
    if (dVar2 != 0) {
      dVar1 = pWav->translatedFormatTag;
      if ((dVar1 == 0x11) || (dVar1 == 2)) {
        (pWav->compressed).iCurrentPCMFrame = 0;
        if (dVar1 == 0x11) {
          (pWav->ima).cachedFrames[0xb] = 0;
          (pWav->ima).cachedFrames[0xc] = 0;
          (pWav->ima).cachedFrames[0xd] = 0;
          (pWav->ima).cachedFrames[0xe] = 0;
          (pWav->ima).cachedFrames[7] = 0;
          (pWav->ima).cachedFrames[8] = 0;
          (pWav->ima).cachedFrames[9] = 0;
          (pWav->ima).cachedFrames[10] = 0;
          (pWav->ima).cachedFrames[3] = 0;
          (pWav->ima).cachedFrames[4] = 0;
          (pWav->ima).cachedFrames[5] = 0;
          (pWav->ima).cachedFrames[6] = 0;
          *(undefined8 *)((pWav->ima).stepIndex + 1) = 0;
          (pWav->ima).cachedFrames[1] = 0;
          (pWav->ima).cachedFrames[2] = 0;
          (pWav->ima).bytesRemainingInBlock = 0;
          (pWav->ima).predictor[0] = 0;
          *(undefined8 *)((pWav->ima).predictor + 1) = 0;
          *(undefined8 *)((pWav->ima).cachedFrames + 0xf) = 0;
        }
        else {
          if (dVar1 != 2) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                          ,0xe4e,"drwav_bool32 drwav_seek_to_first_pcm_frame(drwav *)");
          }
          (pWav->msadpcm).cachedFrameCount = 0;
          *(drwav_int32 *)((long)((pWav->msadpcm).prevFrames + 0) + 0) = 0;
          *(undefined8 *)((pWav->msadpcm).prevFrames[0] + 1) = 0;
          (pWav->msadpcm).cachedFrames[0] = 0;
          (pWav->msadpcm).cachedFrames[1] = 0;
          (pWav->msadpcm).cachedFrames[2] = 0;
          (pWav->msadpcm).cachedFrames[3] = 0;
          (pWav->msadpcm).bytesRemainingInBlock = 0;
          (pWav->msadpcm).predictor[0] = 0;
          (pWav->msadpcm).predictor[1] = 0;
          (pWav->msadpcm).delta[0] = 0;
          (pWav->msadpcm).delta[1] = 0;
          (pWav->msadpcm).prevFrames[1][1] = 0;
        }
      }
      pWav->bytesRemaining = pWav->dataChunkDataSize;
      dVar3 = 1;
    }
  }
  return dVar3;
}

Assistant:

DRWAV_API drwav_bool32 drwav_seek_to_first_pcm_frame(drwav* pWav)
{
    if (pWav->onWrite != NULL) {
        return DRWAV_FALSE; /* No seeking in write mode. */
    }

    if (!pWav->onSeek(pWav->pUserData, (int)pWav->dataChunkDataPos, drwav_seek_origin_start)) {
        return DRWAV_FALSE;
    }

    if (drwav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        pWav->compressed.iCurrentPCMFrame = 0;

        /* Cached data needs to be cleared for compressed formats. */
        if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
            DRWAV_ZERO_OBJECT(&pWav->msadpcm);
        } else if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
            DRWAV_ZERO_OBJECT(&pWav->ima);
        } else {
            DRWAV_ASSERT(DRWAV_FALSE);  /* If this assertion is triggered it means I've implemented a new compressed format but forgot to add a branch for it here. */
        }
    }
    
    pWav->bytesRemaining = pWav->dataChunkDataSize;
    return DRWAV_TRUE;
}